

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<bool> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<bool>(&local_38,(bool *)&(this->super_ITransientExpression).field_0xa);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }